

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O0

int __thiscall
nuraft::nuraft_global_mgr::worker_handle::shutdown(worker_handle *this,int __fd,int __how)

{
  bool bVar1;
  int extraout_EAX;
  undefined7 extraout_var;
  EventAwaiter *unaff_retaddr;
  bool in_stack_ffffffffffffffef;
  int iVar2;
  
  std::atomic<bool>::operator=((atomic<bool> *)this,in_stack_ffffffffffffffef);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->thread_);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2bd113);
    bVar1 = std::thread::joinable((thread *)this);
    if (bVar1) {
      EventAwaiter::invoke(unaff_retaddr);
      std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2bd13d);
      std::thread::join();
    }
    std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2> *)unaff_retaddr);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void shutdown() {
        stopping_ = true;
        if (thread_) {
            if (thread_->joinable()) {
                ea_.invoke();
                thread_->join();
            }
            thread_.reset();
        }
    }